

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression *
build_ir_derefstruct(Context_conflict *ctx,MOJOSHADER_astExpressionDerefStruct *ast)

{
  MOJOSHADER_astDataTypeType MVar1;
  int iVar2;
  MOJOSHADER_astDataType *dt_00;
  MOJOSHADER_astDataType *pMVar3;
  MOJOSHADER_irExpression *local_40;
  MOJOSHADER_irExpression *finalexpr;
  MOJOSHADER_irExpression *expr;
  int elems;
  MOJOSHADER_astDataTypeType type;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astExpressionDerefStruct *ast_local;
  Context_conflict *ctx_local;
  
  dt_00 = reduce_datatype(ctx,ast->datatype);
  pMVar3 = datatype_base(ctx,dt_00);
  MVar1 = pMVar3->type;
  iVar2 = datatype_elems(ctx,dt_00);
  ctx_local = (Context_conflict *)build_ir_expr(ctx,ast->identifier);
  if ((MOJOSHADER_irExpression *)ctx_local == (MOJOSHADER_irExpression *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    local_40 = (MOJOSHADER_irExpression *)ctx_local;
    if (ast->isswizzle != 0) {
      __assert_fail("!ast->isswizzle",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x14d4,
                    "MOJOSHADER_irExpression *build_ir_derefstruct(Context *, const MOJOSHADER_astExpressionDerefStruct *)"
                   );
    }
    for (; (local_40->ir).type == MOJOSHADER_IR_ESEQ; local_40 = (local_40->binop).left) {
    }
    if ((local_40->ir).type == MOJOSHADER_IR_TEMP) {
      (local_40->temp).index = ast->member_index + (local_40->temp).index;
    }
    else {
      if ((local_40->ir).type != MOJOSHADER_IR_MEMORY) {
        __assert_fail("0 && \"Unexpected condition\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x14de,
                      "MOJOSHADER_irExpression *build_ir_derefstruct(Context *, const MOJOSHADER_astExpressionDerefStruct *)"
                     );
      }
      (local_40->temp).index = ast->member_index + (local_40->temp).index;
    }
    ((MOJOSHADER_irExprInfo *)ctx_local)->type = MVar1;
    ((MOJOSHADER_irExprInfo *)ctx_local)->elements = iVar2;
  }
  return (MOJOSHADER_irExpression *)ctx_local;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_derefstruct(Context *ctx, const MOJOSHADER_astExpressionDerefStruct *ast)
{
    // There are only three possible IR nodes that contain a struct:
    //  an irTemp, an irMemory, or an irESeq that results in a temp or memory.
    //  As such, we figure out which it is, and offset appropriately for the
    //  member.
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    MOJOSHADER_irExpression *expr = build_ir_expr(ctx, ast->identifier);
    MOJOSHADER_irExpression *finalexpr = expr;

    if (expr == NULL)
        return NULL;

    assert(!ast->isswizzle);

    while (finalexpr->ir.type == MOJOSHADER_IR_ESEQ)
        finalexpr = finalexpr->eseq.expr;

    if (finalexpr->ir.type == MOJOSHADER_IR_TEMP)
        finalexpr->temp.index += ast->member_index;
    else if (finalexpr->ir.type == MOJOSHADER_IR_MEMORY)
        finalexpr->memory.index += ast->member_index;
    else
        assert(0 && "Unexpected condition");

    // Replace the struct type with the type of the member.
    expr->info.type = type;
    expr->info.elements = elems;

    return expr;
}